

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O3

bool dgrminer::is_pattern_edge_smaller_than
               (array<int,_10UL> *pattern_edge1,array<int,_10UL> *pattern_edge2,bool ignore_edge_id)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  ulong uVar6;
  bool bVar7;
  
  iVar1 = pattern_edge1->_M_elems[0];
  iVar2 = pattern_edge1->_M_elems[1];
  iVar3 = pattern_edge2->_M_elems[0];
  iVar4 = pattern_edge2->_M_elems[1];
  if (iVar1 < iVar2) {
    if (iVar3 < iVar4) {
      bVar5 = iVar2 == iVar4 && iVar3 < iVar1 || iVar2 < iVar4;
    }
    else {
      bVar5 = iVar2 <= iVar3;
    }
  }
  else if (iVar3 < iVar4) {
    bVar5 = iVar1 < iVar4;
  }
  else {
    bVar5 = iVar2 < iVar4 && iVar1 == iVar3 || iVar1 < iVar3;
  }
  if (((iVar2 == iVar4 && iVar1 == iVar3) & ~bVar5) == 1) {
    uVar6 = 0;
    while( true ) {
      if (pattern_edge1->_M_elems[uVar6 + 2] < pattern_edge2->_M_elems[uVar6 + 2]) break;
      if (pattern_edge2->_M_elems[uVar6 + 2] < pattern_edge1->_M_elems[uVar6 + 2]) {
        return bVar5;
      }
      bVar7 = ((ulong)ignore_edge_id ^ 7) == uVar6;
      uVar6 = uVar6 + 1;
      if (bVar7) {
        return bVar5;
      }
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool
    is_pattern_edge_smaller_than(const std::array<int, 10> &pattern_edge1, const std::array<int, 10> &pattern_edge2,
                                 bool ignore_edge_id)
    {
        int max_index = (ignore_edge_id) ? 9 : 10;
        bool result = false;
        int i1 = pattern_edge1[0];
        int j1 = pattern_edge1[1];
        int i2 = pattern_edge2[0];
        int j2 = pattern_edge2[1];
        if (i1 < j1) // edge1 is forward
        {
            if (i2 < j2) // edge2 is forward
            {
                result = (j1 < j2) || (i1 > i2 && j1 == j2);
            }
            else // edge2 is backward
            {

                result = j1 <= i2;
            }
        }
        else // edge1 is backward
        {
            if (i2 < j2) // edge2 is forward
            {
                result = i1 < j2;
            }
            else // edge2 is backward
            {
                result = (i1 < i2) || (i1 == i2 && j1 < j2);
            }
        }
        if (!result && i1 == i2 && j1 == j2)
        {
            // check also edge ID (the 10th element)
            for (int k = 2; k < max_index; k++)
            {
                if (pattern_edge1[k] < pattern_edge2[k])
                {
                    result = true;
                    break;
                }
                else if (pattern_edge1[k] > pattern_edge2[k])
                {
                    break;
                }
            }
        }
        return result;
    }